

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptErrors.h
# Opt level: O1

void __thiscall
MiniScript::TooManyArgumentsException::TooManyArgumentsException
          (TooManyArgumentsException *this,String *msg)

{
  long *plVar1;
  String local_20;
  
  local_20.isTemp = false;
  local_20.ss = msg->ss;
  if (local_20.ss != (StringStorage *)0x0) {
    plVar1 = &((local_20.ss)->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + 1;
  }
  RuntimeException::RuntimeException(&this->super_RuntimeException,&local_20);
  if ((local_20.ss != (StringStorage *)0x0) && (local_20.isTemp == false)) {
    plVar1 = &((local_20.ss)->super_RefCountedStorage).refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*((local_20.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
  }
  *(undefined ***)&(this->super_RuntimeException).super_MiniscriptException =
       &PTR__MiniscriptException_001d19c8;
  return;
}

Assistant:

TooManyArgumentsException(String msg="Too Many Arguments") : RuntimeException(msg) {}